

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O1

void Imath_2_5::minEigenVector<Imath_2_5::Matrix33<double>,Imath_2_5::Vec3<double>>
               (Matrix33<double> *A,Vec3<double> *V)

{
  int iVar1;
  uint i;
  long lVar2;
  double *pdVar3;
  int iVar4;
  Vec3<double> S;
  Matrix33<double> MV;
  Vec3<double> local_70;
  Matrix33<double> local_58;
  
  local_58.x[0][1] = 0.0;
  local_58.x[1][2] = 0.0;
  local_58.x[2][0] = 0.0;
  local_58.x[2][1] = 0.0;
  local_58.x[0][2] = 0.0;
  local_58.x[1][0] = 0.0;
  local_58.x[0][0] = 1.0;
  local_58.x[1][1] = 1.0;
  local_58.x[2][2] = 1.0;
  jacobiEigenSolver<double>(A,&local_70,&local_58,2.220446049250313e-16);
  iVar4 = 0;
  lVar2 = 1;
  do {
    iVar1 = (int)lVar2;
    if (ABS((&local_70.x)[iVar4]) <= ABS((&local_70.x)[lVar2])) {
      iVar1 = iVar4;
    }
    iVar4 = iVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  pdVar3 = local_58.x[0] + iVar4;
  lVar2 = 0;
  do {
    (&V->x)[lVar2] = *pdVar3;
    lVar2 = lVar2 + 1;
    pdVar3 = pdVar3 + 3;
  } while (lVar2 != 3);
  return;
}

Assistant:

void
minEigenVector (TM& A, TV& V)
{
    TV S;
    TM MV;
    jacobiEigenSolver(A, S, MV);

    int minIdx(0);
    for(unsigned int i = 1; i < TV::dimensions(); ++i)
    {
        if(std::abs(S[i]) < std::abs(S[minIdx]))
            minIdx = i;
    }

   for(unsigned int i = 0; i < TV::dimensions(); ++i)
        V[i] = MV[i][minIdx];
}